

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O0

void __thiscall Array::Array(Array *this,int sz)

{
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_28;
  int local_14;
  Array *pAStack_10;
  int sz_local;
  Array *this_local;
  
  local_14 = sz;
  pAStack_10 = this;
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            (&this->theArray,(nullptr_t)0x0);
  this->totSize = local_14;
  this->theSize = 0;
  if (0 < local_14) {
    std::make_shared<std::vector<int,std::allocator<int>>,int&>((int *)&local_28);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::operator=(&this->theArray,&local_28);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_28);
  }
  return;
}

Assistant:

Array::Array(int sz) {
    totSize = sz;
    theSize = 0;
    if (sz > 0) {
        theArray = make_shared<vint>(sz);
    }
}